

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,duckdb::hugeint_t>
          (TryCast *this,string_t input,hugeint_t *result,bool strict)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t iVar14;
  ExponentData exponent;
  HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long> local_98;
  string_t input_local;
  
  input_local.value.pointer.ptr = input.value._0_8_;
  pcVar11 = input.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar11 = input_local.value.pointer.prefix;
  }
  uVar7 = (ulong)this & 0xffffffff;
  uVar13 = 0;
  while( true ) {
    uVar12 = uVar7 - uVar13;
    if (uVar12 == 0) {
      return false;
    }
    bVar5 = pcVar11[uVar13];
    if ((0x20 < (ulong)bVar5) || ((0x100003e00U >> ((ulong)bVar5 & 0x3f) & 1) == 0)) break;
    uVar13 = uVar13 + 1;
  }
  local_98.decimal_intermediate.upper = 0;
  local_98.decimal_intermediate_digits = 0;
  local_98._74_6_ = 0;
  local_98.decimal_total_digits = 0;
  local_98._50_6_ = 0;
  local_98.decimal_intermediate.lower = 0;
  local_98.decimal.lower = 0;
  local_98.decimal.upper = 0;
  local_98.intermediate = 0;
  local_98.digits = '\0';
  local_98._25_7_ = 0;
  local_98.result.lower = 0;
  local_98.result.upper = 0;
  bVar8 = (byte)result;
  input_local.value._0_8_ = this;
  if (bVar5 == 0x2d) {
    uVar6 = 1;
    while (uVar10 = uVar6, uVar10 < uVar12) {
      bVar5 = pcVar11[uVar13 + uVar10];
      if (9 < (byte)(bVar5 - 0x30)) {
        uVar6 = uVar10;
        if (bVar5 != 0x2e) goto LAB_0164d878;
        if (bVar8 != 0) {
          return false;
        }
        uVar9 = uVar10 + 1;
        uVar1 = uVar9;
        goto LAB_0164d7c2;
      }
      bVar4 = HugeIntegerCastOperation::
              HandleDigit<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true>
                        (&local_98,bVar5 - 0x30);
      if (!bVar4) {
        return false;
      }
      uVar6 = uVar12;
      if ((~uVar10 + uVar7 != uVar13) &&
         (uVar6 = uVar10 + 1, pcVar11[uVar13 + 1 + uVar10] == '_' && bVar8 == 0)) {
        if ((uVar7 - uVar10) - 2 == uVar13) {
          return false;
        }
        uVar6 = uVar10 + 2;
        if (9 < (byte)(pcVar11[uVar13 + 2 + uVar10] - 0x30U)) {
          return false;
        }
      }
    }
LAB_0164d780:
    bVar4 = HugeIntegerCastOperation::
            Finalize<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true>
                      (&local_98);
    if (!bVar4) {
      return false;
    }
    if (uVar10 < 2) {
      return false;
    }
    goto LAB_0164d906;
  }
  if ((uVar7 - 1 == uVar13) || (bVar5 != 0x30)) {
    if ((bVar5 == 0x2b & bVar8) != 0) {
      return false;
    }
    uVar10 = (ulong)(bVar5 == 0x2b);
    uVar6 = uVar10;
LAB_0164d6f2:
    while (uVar9 = uVar6, uVar6 = uVar9, uVar9 < uVar12) {
      bVar5 = pcVar11[uVar13 + uVar9];
      if (9 < (byte)(bVar5 - 0x30)) {
        if (bVar5 != 0x2e) goto LAB_0164da08;
        if (bVar8 != 0) {
          return false;
        }
        uVar1 = uVar9 + 1;
        uVar3 = uVar1;
        goto LAB_0164d940;
      }
      bVar4 = HugeIntegerCastOperation::
              HandleDigit<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>
                        (&local_98,bVar5 - 0x30);
      if (!bVar4) {
        return false;
      }
      uVar6 = uVar12;
      if ((~uVar9 + uVar7 != uVar13) &&
         (uVar6 = uVar9 + 1, pcVar11[uVar13 + 1 + uVar9] == '_' && bVar8 == 0)) {
        if ((uVar7 - uVar9) - 2 == uVar13) {
          return false;
        }
        uVar6 = uVar9 + 2;
        if (9 < (byte)(pcVar11[uVar13 + 2 + uVar9] - 0x30U)) {
          return false;
        }
      }
    }
LAB_0164d8e4:
    bVar4 = HugeIntegerCastOperation::
            Finalize<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>
                      (&local_98);
    if (!bVar4) {
      return false;
    }
    if (uVar6 <= uVar10) {
      return false;
    }
LAB_0164d906:
    *input.value._8_8_ = local_98.result.lower;
    input.value._8_8_[1] = local_98.result.upper;
    return true;
  }
  cVar2 = pcVar11[uVar13 + 1];
  if (cVar2 == 'B') {
LAB_0164d84a:
    if ((uVar7 - uVar13) - 3 < 0xfffffffffffffffe) {
      return false;
    }
  }
  else {
    if (cVar2 != 'x') {
      if (cVar2 == 'b') goto LAB_0164d84a;
      if (cVar2 != 'X') {
        if (((byte)(cVar2 - 0x30U) < 10 & bVar8) != 0) {
          return false;
        }
        uVar10 = 0;
        uVar6 = uVar10;
        goto LAB_0164d6f2;
      }
    }
    if (1 < ~uVar13 + uVar7) {
      bVar5 = pcVar11[uVar13 + 2];
      bVar8 = bVar5 | 0x20;
      if (0x19 < (byte)(bVar5 + 0xbf)) {
        bVar8 = bVar5;
      }
      bVar4 = StringUtil::CharacterIsHex(bVar8);
      if (uVar7 - 3 == uVar13) {
        return false;
      }
      if (!bVar4) {
        return false;
      }
      if (uVar7 - 4 != uVar13) {
        if (pcVar11[uVar13 + 3] == '_') {
          StringUtil::CharacterIsHex(pcVar11[uVar13 + 4]);
          return false;
        }
        return false;
      }
      return false;
    }
  }
  HugeIntegerCastOperation::
  Finalize<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>(&local_98);
  return false;
LAB_0164d7c2:
  uVar6 = uVar1;
  if (uVar6 < uVar12) {
    bVar5 = pcVar11[uVar13 + uVar6];
    if ((byte)(bVar5 - 0x30) < 10) goto code_r0x0164d7e7;
    if (uVar6 <= uVar9 && uVar10 < 2) {
      return false;
    }
LAB_0164d878:
    if (bVar5 - 9 < 5) {
LAB_0164d891:
      uVar6 = uVar6 + 1;
      uVar10 = uVar6;
      if (uVar6 < uVar12) {
        uVar10 = uVar12;
      }
      for (; uVar6 < uVar12; uVar6 = uVar6 + 1) {
        if (0x20 < (ulong)(byte)pcVar11[uVar13 + uVar6]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)pcVar11[uVar13 + uVar6] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_0164d780;
    }
    if ((bVar5 != 0x65) && (bVar5 != 0x45)) {
      if (bVar5 != 0x20) {
        return false;
      }
      goto LAB_0164d891;
    }
    if (uVar6 == 1 || bVar8 != 0) {
      return false;
    }
    if (uVar12 <= uVar6 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar11 = pcVar11 + uVar13 + uVar6 + 1;
    iVar14 = ~uVar13 + (uVar7 - uVar6);
    if (*pcVar11 == '-') {
      bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar11,iVar14,&exponent,false);
    }
    else {
      bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar11,iVar14,&exponent,false);
    }
    if (bVar4 == false) {
      return false;
    }
    bVar4 = HugeIntegerCastOperation::
            HandleExponent<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true>
                      (&local_98,(int)exponent.result);
    goto LAB_0164dbe3;
  }
  bVar4 = uVar10 < 2;
  uVar10 = uVar6;
  if (uVar6 <= uVar9 && bVar4) {
    return false;
  }
  goto LAB_0164d780;
code_r0x0164d7e7:
  bVar4 = HugeIntegerCastOperation::
          HandleDecimal<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true,true>
                    (&local_98,bVar5 - 0x30);
  if (!bVar4) {
    return false;
  }
  uVar1 = uVar12;
  if ((~uVar6 + uVar7 != uVar13) && (uVar1 = uVar6 + 1, pcVar11[uVar13 + 1 + uVar6] == '_')) {
    if ((uVar7 - uVar6) - 2 == uVar13) {
      return false;
    }
    uVar1 = uVar6 + 2;
    if (9 < (byte)(pcVar11[uVar13 + 2 + uVar6] - 0x30U)) {
      return false;
    }
  }
  goto LAB_0164d7c2;
LAB_0164d940:
  uVar6 = uVar3;
  if (uVar6 < uVar12) {
    bVar5 = pcVar11[uVar13 + uVar6];
    if ((byte)(bVar5 - 0x30) < 10) goto code_r0x0164d965;
    if (uVar6 <= uVar1 && uVar9 <= uVar10) {
      return false;
    }
LAB_0164da08:
    if (4 < bVar5 - 9) {
      if ((bVar5 == 0x65) || (bVar5 == 0x45)) {
        if (uVar6 == uVar10 || bVar8 != 0) {
          return false;
        }
        if (uVar12 <= uVar6 + 1) {
          return false;
        }
        exponent.result = 0;
        pcVar11 = pcVar11 + uVar13 + uVar6 + 1;
        iVar14 = ~uVar13 + (uVar7 - uVar6);
        if (*pcVar11 == '-') {
          bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar11,iVar14,&exponent,false);
        }
        else {
          bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar11,iVar14,&exponent,false);
        }
        if (bVar4 == false) {
          return false;
        }
        bVar4 = HugeIntegerCastOperation::
                HandleExponent<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>
                          (&local_98,(int)exponent.result);
LAB_0164dbe3:
        if (bVar4 == false) {
          return false;
        }
        goto LAB_0164d906;
      }
      if (bVar5 != 0x20) {
        return false;
      }
    }
    uVar7 = uVar6 + 1;
    uVar6 = uVar7;
    if (uVar7 < uVar12) {
      uVar6 = uVar12;
    }
    for (; uVar7 < uVar12; uVar7 = uVar7 + 1) {
      if (0x20 < (ulong)(byte)pcVar11[uVar13 + uVar7]) {
        return false;
      }
      if ((0x100003e00U >> ((ulong)(byte)pcVar11[uVar13 + uVar7] & 0x3f) & 1) == 0) {
        return false;
      }
    }
  }
  else if (uVar6 <= uVar1 && uVar9 <= uVar10) {
    return false;
  }
  goto LAB_0164d8e4;
code_r0x0164d965:
  bVar4 = HugeIntegerCastOperation::
          HandleDecimal<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false,true>
                    (&local_98,bVar5 - 0x30);
  if (!bVar4) {
    return false;
  }
  uVar3 = uVar12;
  if ((~uVar6 + uVar7 != uVar13) && (uVar3 = uVar6 + 1, pcVar11[uVar13 + 1 + uVar6] == '_')) {
    if ((uVar7 - uVar6) - 2 == uVar13) {
      return false;
    }
    uVar3 = uVar6 + 2;
    if (9 < (byte)(pcVar11[uVar13 + 2 + uVar6] - 0x30U)) {
      return false;
    }
  }
  goto LAB_0164d940;
}

Assistant:

bool TryCast::Operation(string_t input, hugeint_t &result, bool strict) {
	HugeIntCastData<hugeint_t, Hugeint, int64_t> state {};
	if (!TryIntegerCast<HugeIntCastData<hugeint_t, Hugeint, int64_t>, true, true, HugeIntegerCastOperation>(
	        input.GetData(), input.GetSize(), state, strict)) {
		return false;
	}
	result = state.result;
	return true;
}